

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall
OpenMD::DataStorage::internalCopy<double>
          (DataStorage *this,vector<double,_std::allocator<double>_> *v,int source,size_t num,
          size_t target)

{
  iterator __first;
  iterator __last;
  iterator __result;
  iterator result;
  iterator last;
  iterator first;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30 [6];
  
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(local_30);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_38);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_40);
  __first = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  local_30[0]._M_current = __first._M_current;
  __last = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  local_38._M_current = __last._M_current;
  __result = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  local_40._M_current = __result._M_current;
  std::advance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             __last._M_current,(int)((ulong)__result._M_current >> 0x20));
  std::
  advance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,unsigned_long>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             __last._M_current,(unsigned_long)__result._M_current);
  std::
  advance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,unsigned_long>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             __last._M_current,(unsigned_long)__result._M_current);
  std::
  copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __result._M_current);
  return;
}

Assistant:

void DataStorage::internalCopy(std::vector<T>& v, int source, std::size_t num,
                                 std::size_t target) {
    typename std::vector<T>::iterator first;
    typename std::vector<T>::iterator last;
    typename std::vector<T>::iterator result;

    first  = v.begin();
    last   = v.begin();
    result = v.begin();

    std::advance(first, source);
    // STL algorithm use half opened range
    std::advance(last, num + 1);
    std::advance(result, target);

    std::copy(first, last, result);
  }